

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<QVariant>::
     call<QtPromise::QPromiseResolve<QVariant>,QtPromise::QPromiseReject<QVariant>,std::function<QVariant(int_const&)>,int_const&>
               (QPromiseResolve<QVariant> *resolve,QPromiseReject<QVariant> *reject,
               function<QVariant_(const_int_&)> *fn,int *args)

{
  QVariant local_30;
  
  std::function<QVariant_(const_int_&)>::operator()(&local_30,fn,args);
  PromiseResolver<QVariant>::resolve<QVariant>(&resolve->m_resolver,&local_30);
  QVariant::~QVariant(&local_30);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }